

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  
  sVar2 = j->marker;
  if (sVar2 == 0xff) {
    sVar1 = stbi__get8(j->s);
    sVar2 = 0xff;
    while (sVar1 == 0xff) {
      sVar2 = stbi__get8(j->s);
      sVar1 = sVar2;
    }
  }
  else {
    j->marker = 0xff;
  }
  return sVar2;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}